

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O0

int32 rw::d3d9::getSizeNativeData(void *object,int32 param_2,int32 param_3)

{
  int iVar1;
  long lVar2;
  uint32 uVar3;
  uint32 numElt;
  int32 size;
  InstanceDataHeader *header;
  Geometry *geometry;
  int32 param_2_local;
  int32 param_1_local;
  void *object_local;
  
  if ((*(long *)((long)object + 0x98) == 0) || (**(int **)((long)object + 0x98) != 9)) {
    object_local._4_4_ = 0;
  }
  else {
    lVar2 = *(long *)((long)object + 0x98);
    iVar1 = *(int *)(lVar2 + 8);
    uVar3 = getDeclaration(*(void **)(lVar2 + 0x58),(VertexElement *)0x0);
    object_local._4_4_ =
         *(int *)(lVar2 + 0x44) * *(int *)(lVar2 + 100) +
         *(int *)(lVar2 + 0x2c) * *(int *)(lVar2 + 100) +
         *(int *)(lVar2 + 0x60) * 2 + uVar3 * 8 + iVar1 * 0x24 + 0x78;
  }
  return object_local._4_4_;
}

Assistant:

int32
getSizeNativeData(void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_D3D9)
		return 0;
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	int32 size = 12 + 4 + 4 + 64 + header->numMeshes*36;
	uint32 numElt = getDeclaration(header->vertexDeclaration, nil);
	size += 4 + numElt*8;
	size += 2*header->totalNumIndex;
	size += 0x10 + header->vertexStream[0].stride*header->totalNumVertex;
	size += 0x10 + header->vertexStream[1].stride*header->totalNumVertex;
	return size;
}